

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

void Assimp::ExportSceneGLTF
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  glTFExporter exporter;
  glTFExporter local_80;
  
  glTFExporter::glTFExporter(&local_80,pFile,pIOSystem,pScene,pProperties,false);
  glTFExporter::~glTFExporter(&local_80);
  return;
}

Assistant:

void ExportSceneGLTF(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* pProperties)
    {
        // invoke the exporter
        glTFExporter exporter(pFile, pIOSystem, pScene, pProperties, false);
    }